

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O0

compile_errcode __thiscall Expression::Generate(Expression *this,string *expression_string)

{
  string *psVar1;
  bool bVar2;
  SymbolName name_00;
  string local_2d0;
  string local_2b0;
  string local_290;
  undefined1 local_270 [8];
  Pcode pcode_1;
  string local_1c8;
  string local_1a8;
  string local_188;
  undefined1 local_168 [8];
  Pcode pcode;
  PcodeType local_bc;
  SymbolName name;
  PcodeType pcode_type;
  string temp;
  string term_string2;
  string term_string1;
  allocator local_41;
  string local_40 [8];
  string add_identity;
  int state;
  int ret;
  string *expression_string_local;
  Expression *this_local;
  
  add_identity.field_2._12_4_ = 0;
  add_identity.field_2._8_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"0",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::string((string *)(term_string2.field_2._M_local_buf + 8),local_40);
  std::__cxx11::string::string((string *)(temp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&name);
  local_bc = ADD;
  do {
    name_00 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (add_identity.field_2._8_4_ == 0) {
      bVar2 = IsAddOperation(name_00);
      if (bVar2) {
        if (name_00 == SUB_SYM) {
          local_bc = SUB;
        }
        add_identity.field_2._8_4_ = 0;
      }
      else {
        if (local_bc == SUB) {
          Term::Generate(&this->m_term,(string *)((long)&temp.field_2 + 8));
          PcodeGenerator::GetNextTemp_abi_cxx11_
                    ((string *)((long)&pcode.m_comment.field_2 + 8),pcode_generator);
          psVar1 = (string *)(pcode.m_comment.field_2._M_local_buf + 8);
          std::__cxx11::string::operator=((string *)&name,psVar1);
          std::__cxx11::string::~string(psVar1);
          std::__cxx11::string::string((string *)&local_188,(string *)&name);
          std::__cxx11::string::string
                    ((string *)&local_1a8,(string *)(term_string2.field_2._M_local_buf + 8));
          std::__cxx11::string::string
                    ((string *)&local_1c8,(string *)(temp.field_2._M_local_buf + 8));
          Pcode::Pcode((Pcode *)local_168,SUB,&local_188,&local_1a8,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_188);
          PcodeGenerator::Insert(pcode_generator,(Pcode *)local_168);
          std::__cxx11::string::operator=
                    ((string *)(term_string2.field_2._M_local_buf + 8),(string *)&name);
          Pcode::~Pcode((Pcode *)local_168);
        }
        else {
          Term::Generate(&this->m_term,(string *)((long)&term_string2.field_2 + 8));
        }
        add_identity.field_2._8_4_ = 1;
      }
    }
    else if (add_identity.field_2._8_4_ == 1) {
      bVar2 = IsAddOperation(name_00);
      if (!bVar2) {
        std::__cxx11::string::operator=
                  ((string *)expression_string,(string *)(term_string2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)(temp.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(term_string2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string(local_40);
        return 0;
      }
      local_bc = (PcodeType)(name_00 != ADD_SYM);
      add_identity.field_2._8_4_ = 2;
    }
    else if (add_identity.field_2._8_4_ == 2) {
      Term::Generate(&this->m_term,(string *)((long)&temp.field_2 + 8));
      PcodeGenerator::GetNextTemp_abi_cxx11_
                ((string *)((long)&pcode_1.m_comment.field_2 + 8),pcode_generator);
      psVar1 = (string *)(pcode_1.m_comment.field_2._M_local_buf + 8);
      std::__cxx11::string::operator=((string *)&name,psVar1);
      std::__cxx11::string::~string(psVar1);
      std::__cxx11::string::string((string *)&local_290,(string *)&name);
      std::__cxx11::string::string
                ((string *)&local_2b0,(string *)(term_string2.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&local_2d0,(string *)(temp.field_2._M_local_buf + 8));
      Pcode::Pcode((Pcode *)local_270,local_bc,&local_290,&local_2b0,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_290);
      PcodeGenerator::Insert(pcode_generator,(Pcode *)local_270);
      std::__cxx11::string::operator=
                ((string *)(term_string2.field_2._M_local_buf + 8),(string *)&name);
      add_identity.field_2._8_4_ = 1;
      Pcode::~Pcode((Pcode *)local_270);
    }
    if (add_identity.field_2._8_4_ != 1) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode Expression::Generate(string& expression_string) {
    int ret = COMPILE_OK;
    int state = 0;
    string add_identity("0");
    string term_string1 = add_identity;
    string term_string2;
    string temp;
    PcodeType pcode_type = ADD;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsAddOperation(name)) {
                    if (name == SUB_SYM) {
                        pcode_type = SUB;
                    }
                    state = 0;
                    break;
                } else {
                    if (pcode_type == SUB) {
                        m_term.Generate(term_string2);
                        temp = pcode_generator->GetNextTemp();
                        Pcode pcode(SUB, temp, term_string1, term_string2);
                        pcode_generator->Insert(pcode);
                        term_string1 = temp;
                    } else {
                        m_term.Generate(term_string1);
                    }
                    state = 1;
                    break;
                }
            }
            case 1: {
                if (IsAddOperation(name)) {
                    if (name == ADD_SYM) {
                        pcode_type = ADD;
                    } else {
                        pcode_type = SUB;
                    }
                    state = 2;
                    break;
                } else {
                    expression_string = term_string1;
                    return COMPILE_OK;
                }
            }
            case 2: {
                m_term.Generate(term_string2);
                temp = pcode_generator->GetNextTemp();
                Pcode pcode(pcode_type, temp, term_string1, term_string2);
                pcode_generator->Insert(pcode);
                term_string1 = temp;
                state = 1;
            }
        }
        if (state != 1) {
            handle_correct_queue->NextSymbol();
        }
    }
}